

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_buffer_method_get(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef *pTVar2;
  long lVar3;
  TRef TVar4;
  TRef TVar5;
  TRef TVar6;
  IRRef1 IVar7;
  long lVar8;
  IRRef1 IVar9;
  IRRef1 IVar10;
  
  TVar4 = recff_sbufx_check(J,rd,0);
  IVar7 = (IRRef1)TVar4;
  (J->fold).ins.field_0.op1 = IVar7;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090015;
  TVar4 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = IVar7;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090010;
  TVar5 = lj_opt_fold(J);
  pTVar2 = J->base;
  if (pTVar2[1] == 0) {
    pTVar2[1] = 0x7fff;
    pTVar2[2] = 0;
  }
  lVar8 = 0;
  uVar1 = J->base[1];
  while (uVar1 != 0) {
    (J->fold).ins.field_0.ot = 0x2a15;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    IVar9 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = IVar9;
    TVar4 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
    TVar4 = lj_opt_fold(J);
    IVar10 = (IRRef1)TVar4;
    TVar4 = TVar5;
    if ((uVar1 & 0x1f000000) != 0) {
      TVar4 = recff_sbufx_checkint(J,rd,(int)lVar8 + 1);
      (J->fold).ins.field_0.ot = 0x3213;
      (J->fold).ins.field_0.op1 = IVar10;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar4 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar9;
      IVar10 = (IRRef1)TVar4;
      (J->fold).ins.field_0.op2 = IVar10;
      TVar4 = lj_opt_fold(J);
    }
    (J->fold).ins.field_0.ot = 0x5004;
    (J->fold).ins.field_0.op1 = IVar9;
    (J->fold).ins.field_0.op2 = IVar10;
    TVar6 = lj_opt_fold(J);
    J->base[lVar8] = TVar6;
    (J->fold).ins.field_0.op1 = IVar7;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090015;
    TVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    lVar3 = lVar8 + 2;
    lVar8 = lVar8 + 1;
    uVar1 = J->base[lVar3];
  }
  rd->nres = lVar8;
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_get(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trr = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_R);
  TRef trw = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_W);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) { J->base[1] = TREF_NIL; J->base[2] = 0; }
  for (arg = 0; (tr = J->base[arg+1]); arg++) {
    TRef len = recff_sbufx_len(J, trr, trw);
    if (tref_isnil(tr)) {
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = trw;
    } else {
      TRef trn = recff_sbufx_checkint(J, rd, arg+1);
      TRef tru;
      len = emitir(IRTI(IR_MIN), len, trn);
      tru = emitir(IRT(IR_ADD, IRT_PTR), trr, len);
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = tru;  /* Doing the ADD before the SNEW generates better code. */
    }
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trr);
  }
  rd->nres = arg;
}